

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnElemSegmentElemExpr_RefFunc
          (SharedValidator *this,Location *loc,Var *func_var)

{
  Var *loc_00;
  reference pvVar1;
  char *pcVar2;
  int __c;
  value_type_conflict2 local_8c;
  Var local_88;
  Enum local_40;
  Type local_3c;
  Type local_34;
  Enum local_2c;
  Var *local_28;
  Var *func_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = func_var;
  func_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  loc_00 = func_var_local;
  Type::Type(&local_34,FuncRef);
  pvVar1 = std::
           vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
           ::back(&this->elems_);
  local_3c = pvVar1->element;
  local_2c = (Enum)CheckType(this,&loc_00->loc,local_34,local_3c,"elem expression");
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_2c);
  Var::Var(&local_88,func_var);
  local_40 = (Enum)CheckFuncIndex(this,&local_88,(FuncType *)0x0);
  pcVar2 = (char *)(ulong)local_40;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_40);
  Var::~Var(&local_88);
  pcVar2 = Var::index(func_var,pcVar2,__c);
  local_8c = (value_type_conflict2)pcVar2;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            (&this->declared_funcs_,&local_8c);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnElemSegmentElemExpr_RefFunc(const Location& loc,
                                                      Var func_var) {
  Result result = Result::Ok;
  result |=
      CheckType(loc, Type::FuncRef, elems_.back().element, "elem expression");
  result |= CheckFuncIndex(func_var);
  declared_funcs_.insert(func_var.index());
  return result;
}